

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O1

bool __thiscall
google::protobuf::TextFormat::Parser::ParserImpl::Parse(ParserImpl *this,Message *output)

{
  bool bVar1;
  LogMessage *pLVar2;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  int local_24;
  LogMessage local_20;
  
  while ((this->tokenizer_).current_.type != TYPE_END) {
    bVar1 = ConsumeField(this,output);
    if (!bVar1) {
      return false;
    }
  }
  if ((this->had_errors_ == false) && (this->recursion_limit_ != this->initial_recursion_limit_)) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_20,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/text_format.cc"
               ,0x15f,"had_errors_ || recursion_limit_ == initial_recursion_limit_");
    str._M_str = "Recursion limit at end of parse should be ";
    str._M_len = 0x2a;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(&local_20,str);
    local_24 = this->initial_recursion_limit_;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(&local_20,&local_24);
    str_00._M_str = ", but was ";
    str_00._M_len = 10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_00);
    local_24 = this->recursion_limit_;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(pLVar2,&local_24);
    str_01._M_str = ". Difference of ";
    str_01._M_len = 0x10;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_01);
    local_24 = this->initial_recursion_limit_ - this->recursion_limit_;
    pLVar2 = absl::lts_20250127::log_internal::LogMessage::operator<<<int,_0>(pLVar2,&local_24);
    str_02._M_str = " stack frames not accounted for stack unwind.";
    str_02._M_len = 0x2d;
    absl::lts_20250127::log_internal::LogMessage::
    CopyToEncodedBuffer<(absl::lts_20250127::log_internal::LogMessage::StringType)0>(pLVar2,str_02);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_20);
  }
  return (bool)(this->had_errors_ ^ 1);
}

Assistant:

bool Parse(Message* output) {
    // Consume fields until we cannot do so anymore.
    while (true) {
      if (LookingAtType(io::Tokenizer::TYPE_END)) {
        // Ensures recursion limit properly unwinded, but only for success
        // cases. This implicitly avoids the check when `Parse` returns false
        // via `DO(...)`.
        ABSL_DCHECK(had_errors_ || recursion_limit_ == initial_recursion_limit_)
            << "Recursion limit at end of parse should be "
            << initial_recursion_limit_ << ", but was " << recursion_limit_
            << ". Difference of " << initial_recursion_limit_ - recursion_limit_
            << " stack frames not accounted for stack unwind.";

        return !had_errors_;
      }

      DO(ConsumeField(output));
    }
  }